

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::AssocArrayTraversalMethod::checkArguments
          (AssocArrayTraversalMethod *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  SourceRange sourceRange;
  SourceRange callRange;
  bool bVar1;
  Compilation *pCVar2;
  Type *pTVar3;
  SystemSubroutine *in_RCX;
  Args *in_RDX;
  undefined8 in_RSI;
  undefined1 isMethod;
  ASTContext *in_RDI;
  SourceLocation in_R8;
  size_t in_stack_00000010;
  size_t in_stack_00000018;
  Type *indexType;
  Type *type;
  Compilation *comp;
  Type *pTVar4;
  Diagnostic *this_00;
  undefined4 in_stack_ffffffffffffff98;
  SourceLocation in_stack_fffffffffffffff8;
  
  isMethod = (undefined1)((ulong)in_RSI >> 0x38);
  pCVar2 = ASTContext::getCompilation((ASTContext *)0xae010f);
  pTVar4 = (Type *)0x1;
  this_00 = (Diagnostic *)0x1;
  callRange.endLoc = in_stack_fffffffffffffff8;
  callRange.startLoc = in_R8;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_RCX,in_RDI,(bool)isMethod,in_RDX,callRange,in_stack_00000010,
                     in_stack_00000018);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
    not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0xae0197);
    pTVar3 = Type::getAssociativeIndexType(pTVar4);
    if (pTVar3 == (Type *)0x0) {
      sourceRange.endLoc._0_4_ = in_stack_ffffffffffffff98;
      sourceRange.startLoc = in_R8;
      sourceRange.endLoc._4_4_ = 0x3000b;
      ASTContext::addDiag((ASTContext *)in_RCX,(DiagCode)0x0,sourceRange);
      Diagnostic::operator<<(this_00,(string *)pTVar4);
      pCVar2 = ASTContext::getCompilation((ASTContext *)0xae020a);
      pTVar4 = Compilation::getErrorType(pCVar2);
    }
    else {
      pTVar4 = Compilation::getIntType(pCVar2);
    }
  }
  else {
    pTVar4 = Compilation::getErrorType(pCVar2);
  }
  return pTVar4;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 1, 1))
            return comp.getErrorType();

        auto& type = *args[0]->type;
        auto indexType = type.getAssociativeIndexType();
        if (!indexType) {
            context.addDiag(diag::AssociativeWildcardNotAllowed, range) << name;
            return context.getCompilation().getErrorType();
        }

        return comp.getIntType();
    }